

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

bool __thiscall HyperLogLog::WriteHyperLogLog(HyperLogLog *this,FILE *F)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_28;
  int i;
  bool ret;
  double E;
  FILE *F_local;
  HyperLogLog *this_local;
  
  dVar3 = Assess(this);
  iVar2 = fprintf((FILE *)F,"%f",dVar3);
  bVar1 = 0 < iVar2;
  for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
    iVar2 = fprintf((FILE *)F,",%u",(ulong)this->hllv[local_28]);
    bVar1 = (bool)(bVar1 & 0 < iVar2);
  }
  return bVar1;
}

Assistant:

bool HyperLogLog::WriteHyperLogLog(FILE* F)
{
    double E = Assess();
    bool ret = (fprintf(F, "%f", E) > 0);
    for (int i = 0; i < 16; i++) {
        ret &= (fprintf(F, ",%u", hllv[i]) > 0);
    }
    return ret;
}